

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

void cmsysProcess_Delete(cmsysProcess *cp)

{
  if (cp != (cmsysProcess *)0x0) {
    if (cp->State == 3) {
      if (cp->Detached == 0) {
        cmsysProcess_WaitForExit(cp,(double *)0x0);
      }
      else {
        cmsysProcess_Disown(cp);
      }
    }
    cmsysProcess_SetCommand(cp,(char **)0x0);
    if (cp->WorkingDirectory != (char *)0x0) {
      free(cp->WorkingDirectory);
      cp->WorkingDirectory = (char *)0x0;
    }
    if (cp->PipeFileSTDIN != (char *)0x0) {
      free(cp->PipeFileSTDIN);
      cp->PipeFileSTDIN = (char *)0x0;
    }
    if (cp->PipeFileSTDIN != (char *)0x0) {
      cp->PipeNativeSTDIN[0] = -1;
      cp->PipeNativeSTDIN[1] = -1;
      cp->PipeSharedSTDIN = 0;
    }
    if (cp->PipeFileSTDOUT != (char *)0x0) {
      free(cp->PipeFileSTDOUT);
      cp->PipeFileSTDOUT = (char *)0x0;
    }
    if (cp->PipeFileSTDOUT != (char *)0x0) {
      cp->PipeNativeSTDOUT[0] = -1;
      cp->PipeNativeSTDOUT[1] = -1;
      cp->PipeSharedSTDOUT = 0;
    }
    if (cp->PipeFileSTDERR != (char *)0x0) {
      free(cp->PipeFileSTDERR);
      cp->PipeFileSTDERR = (char *)0x0;
    }
    if (cp->PipeFileSTDERR != (char *)0x0) {
      cp->PipeNativeSTDERR[0] = -1;
      cp->PipeNativeSTDERR[1] = -1;
      cp->PipeSharedSTDERR = 0;
    }
    free(cp->CommandExitCodes);
    free(cp->ProcessResults);
    free(cp);
    return;
  }
  return;
}

Assistant:

void kwsysProcess_Delete(kwsysProcess* cp)
{
  /* Make sure we have an instance.  */
  if (!cp) {
    return;
  }

  /* If the process is executing, wait for it to finish.  */
  if (cp->State == kwsysProcess_State_Executing) {
    if (cp->Detached) {
      kwsysProcess_Disown(cp);
    } else {
      kwsysProcess_WaitForExit(cp, 0);
    }
  }

  /* Free memory.  */
  kwsysProcess_SetCommand(cp, 0);
  kwsysProcess_SetWorkingDirectory(cp, 0);
  kwsysProcess_SetPipeFile(cp, kwsysProcess_Pipe_STDIN, 0);
  kwsysProcess_SetPipeFile(cp, kwsysProcess_Pipe_STDOUT, 0);
  kwsysProcess_SetPipeFile(cp, kwsysProcess_Pipe_STDERR, 0);
  free(cp->CommandExitCodes);
  free(cp->ProcessResults);
  free(cp);
}